

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::LoadScriptFileHelper
          (JsValueRef callee,JsValueRef *arguments,unsigned_short argumentCount,bool isSourceModule)

{
  undefined8 uVar1;
  JsErrorCode errorCode;
  HRESULT HVar2;
  PAL_FILE *stream;
  char *scriptInjectType_00;
  char16_t *errorMessage;
  undefined1 local_88 [8];
  AutoString scriptInjectType;
  LPCSTR local_60;
  LPCSTR fileContent;
  AutoString fileName;
  JsValueRef returnValue;
  
  fileName.errorCode = JsNoError;
  fileName.dontFree = false;
  fileName._29_3_ = 0;
  if ((ushort)(argumentCount - 5) < 0xfffd) {
    errorMessage = L"Need more or fewer arguments for WScript.LoadScript";
    errorCode = JsErrorInvalidArgument;
  }
  else {
    AutoString::AutoString((AutoString *)&fileContent,arguments[1]);
    errorCode = (JsErrorCode)fileName.data_wide;
    if ((JsErrorCode)fileName.data_wide == JsNoError) {
      scriptInjectType.data._0_5_ = 0;
      scriptInjectType._13_8_ = 0;
      local_88 = (undefined1  [8])0x0;
      scriptInjectType.length._0_5_ = 0;
      scriptInjectType.length._5_3_ = 0;
      if ((argumentCount < 3) ||
         (errorCode = AutoString::Initialize((AutoString *)local_88,arguments[2]),
         errorCode == JsNoError)) {
        HVar2 = Helpers::LoadScriptFromFile
                          ((LPCSTR)fileName.length,&local_60,(UINT *)0x0,(string *)0x0,false);
        if (HVar2 < 0) {
          stream = PAL_get_stderr(0);
          PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",fileName.length);
          errorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)
                                ((JsValueRef *)&fileName.errorCode);
          uVar1 = fileName._24_8_;
          if (errorCode == JsNoError) {
            AutoString::~AutoString((AutoString *)local_88);
            AutoString::~AutoString((AutoString *)&fileContent);
            return (JsValueRef)uVar1;
          }
        }
        else {
          scriptInjectType_00 = "self";
          if ((LPCSTR)CONCAT35(scriptInjectType.length._5_3_,(undefined5)scriptInjectType.length) !=
              (LPCSTR)0x0) {
            scriptInjectType_00 =
                 (LPCSTR)CONCAT35(scriptInjectType.length._5_3_,(undefined5)scriptInjectType.length)
            ;
          }
          fileName._24_8_ =
               LoadScript(callee,(LPCSTR)fileName.length,local_60,scriptInjectType_00,isSourceModule
                          ,FinalizeFree,true);
          errorCode = JsNoError;
        }
      }
      AutoString::~AutoString((AutoString *)local_88);
    }
    AutoString::~AutoString((AutoString *)&fileContent);
    errorMessage = L"";
  }
  SetExceptionIf(errorCode,errorMessage);
  return (JsValueRef)fileName._24_8_;
}

Assistant:

JsValueRef WScriptJsrt::LoadScriptFileHelper(JsValueRef callee, JsValueRef *arguments, unsigned short argumentCount, bool isSourceModule)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;
    LPCWSTR errorMessage = _u("");

    if (argumentCount < 2 || argumentCount > 4)
    {
        errorCode = JsErrorInvalidArgument;
        errorMessage = _u("Need more or fewer arguments for WScript.LoadScript");
    }
    else
    {
        LPCSTR fileContent;
        AutoString fileName(arguments[1]);
        IfJsrtErrorSetGo(fileName.GetError());

        AutoString scriptInjectType;
        if (argumentCount > 2)
        {
            IfJsrtErrorSetGo(scriptInjectType.Initialize(arguments[2]));
        }

        if (errorCode == JsNoError)
        {
            hr = Helpers::LoadScriptFromFile(*fileName, fileContent);
            if (FAILED(hr))
            {
                fprintf(stderr, "Couldn't load file '%s'\n", fileName.GetString());
                IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
                return returnValue;
            }

            returnValue = LoadScript(callee, *fileName, fileContent, *scriptInjectType ? *scriptInjectType : "self", isSourceModule, WScriptJsrt::FinalizeFree, true);
        }
    }

Error:

    SetExceptionIf(errorCode, errorMessage);
    return returnValue;
}